

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

RtreeNode * nodeNew(Rtree *pRtree,RtreeNode *pParent)

{
  RtreeNode *__s;
  RtreeNode *pNode;
  RtreeNode *pParent_local;
  Rtree *pRtree_local;
  
  __s = (RtreeNode *)sqlite3_malloc64((long)pRtree->iNodeSize + 0x28);
  if (__s != (RtreeNode *)0x0) {
    memset(__s,0,(long)pRtree->iNodeSize + 0x28);
    __s->zData = (u8 *)(__s + 1);
    __s->nRef = 1;
    pRtree->nNodeRef = pRtree->nNodeRef + 1;
    __s->pParent = pParent;
    __s->isDirty = 1;
    nodeReference(pParent);
  }
  return __s;
}

Assistant:

static RtreeNode *nodeNew(Rtree *pRtree, RtreeNode *pParent){
  RtreeNode *pNode;
  pNode = (RtreeNode *)sqlite3_malloc64(sizeof(RtreeNode) + pRtree->iNodeSize);
  if( pNode ){
    memset(pNode, 0, sizeof(RtreeNode) + pRtree->iNodeSize);
    pNode->zData = (u8 *)&pNode[1];
    pNode->nRef = 1;
    pRtree->nNodeRef++;
    pNode->pParent = pParent;
    pNode->isDirty = 1;
    nodeReference(pParent);
  }
  return pNode;
}